

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

sstack<dlib::sgd> __thiscall dlib::sstack<dlib::sgd>::pop(sstack<dlib::sgd> *this,size_t num)

{
  size_t sVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *a;
  undefined8 uVar4;
  ulong in_RSI;
  sstack<dlib::sgd> *in_RDI;
  ostringstream dlib_o_out;
  error_type t;
  ostringstream local_198 [376];
  ulong local_20;
  sstack<dlib::sgd> local_10;
  
  local_20 = in_RSI;
  sVar1 = size(in_RDI);
  if (sVar1 < in_RSI) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x239);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_198,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/core.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_198,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,"sstack<T> dlib::sstack<dlib::sgd>::pop(size_t) [T = dlib::sgd]"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_198,"Failing expression was ");
    poVar3 = std::operator<<(poVar2,"num <= size()");
    std::operator<<(poVar3,".\n");
    t = (error_type)((ulong)poVar3 >> 0x20);
    a = (string *)std::ostream::operator<<(local_198,std::boolalpha);
    poVar3 = std::operator<<((ostream *)a,
                             "You can\'t pop more things from the stack than it has in it.");
    std::operator<<(poVar3,"\n");
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,t,a);
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  sstack(&local_10,in_RDI->data + local_20,in_RDI->mysize - local_20);
  return local_10;
}

Assistant:

sstack pop(size_t num=1) 
        { 
            DLIB_CASSERT(num <= size(), "You can't pop more things from the stack than it has in it.");
            return sstack(data+num, mysize-num);
        }